

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkloader.c
# Opt level: O0

ktx_error_code_e
ktxTexture_VkUploadEx_WithSuballocator
          (ktxTexture *This,ktxVulkanDeviceInfo *vdi,ktxVulkanTexture *vkTexture,
          VkImageTiling tiling,VkImageUsageFlags usageFlags,VkImageLayout finalLayout,
          ktxVulkanTexture_subAllocatorCallbacks *subAllocatorCallbacks)

{
  ktxVulkanFunctions vkFuncs;
  ktxVulkanFunctions vkFuncs_00;
  ktxVulkanFunctions vkFuncs_01;
  ktx_bool_t kVar1;
  uint32_t uVar2;
  ktx_error_code_e kVar3;
  undefined8 uVar4;
  code *pcVar5;
  VkImageTiling in_ECX;
  long lVar6;
  undefined8 *in_RDX;
  ktxVulkanDeviceInfo *in_RSI;
  ktxVulkanFunctions *pkVar7;
  int *in_RDI;
  undefined8 *puVar8;
  uint in_R8D;
  undefined4 in_R9D;
  byte bVar9;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar10 [16];
  long *in_stack_00000008;
  VkImageSubresourceRange subresourceRange_1;
  uint64_t numPages_2;
  PFNKTXITERCB callback;
  user_cbdata_linear cbData_1;
  VkSubmitInfo submitInfo_1;
  VkFence nullFence;
  VkDeviceMemory mappableMemory;
  VkImage mappableImage;
  uint64_t numPages_1;
  uint64_t numPages;
  uint64_t stagingAllocId;
  user_cbdata_optimal cbData;
  ktx_uint32_t numCopyRegions;
  ktx_uint8_t *pMappedStagingBuffer;
  VkSubmitInfo submitInfo;
  VkFenceCreateInfo fenceCreateInfo;
  VkFence copyFence;
  VkImageSubresourceRange subresourceRange;
  VkBufferCreateInfo bufferCreateInfo;
  VkDeviceSize textureSize;
  VkBufferImageCopy *copyRegions;
  VkDeviceMemory stagingMemory;
  VkBuffer stagingBuffer;
  ktx_uint32_t tightRowPitch;
  ktx_uint32_t actualRowPitch;
  VkFormatFeatureFlags neededFeatures;
  VkFormatFeatureFlags formatFeatureFlags;
  VkFormatProperties formatProperties;
  uint32_t max_dim;
  ktx_bool_t useSuballocator;
  ktx_bool_t canUseFasterPath;
  ktx_uint32_t elementSize;
  ktx_uint32_t numImageLevels;
  ktx_uint32_t numImageLayers;
  VkMemoryRequirements memReqs;
  VkMemoryAllocateInfo memAllocInfo;
  VkImageCreateInfo imageCreateInfo;
  VkCommandBufferBeginInfo cmdBufBeginInfo;
  VkResult vResult;
  VkImageFormatProperties imageFormatProperties;
  VkImageCreateFlags createFlags;
  VkImageViewType viewType;
  VkImageType imageType;
  VkFormat vkFormat;
  VkFilter blitFilter;
  ktx_error_code_e kResult;
  ktxTexture *in_stack_fffffffffffffa88;
  ktxTexture *in_stack_fffffffffffffa90;
  ktx_uint32_t in_stack_fffffffffffffa9c;
  ktxTexture *in_stack_fffffffffffffaa0;
  void *in_stack_fffffffffffffac8;
  PFNKTXITERCB in_stack_fffffffffffffad0;
  ktxTexture *in_stack_fffffffffffffad8;
  VkImageLayout in_stack_fffffffffffffb10;
  VkImageLayout in_stack_fffffffffffffb14;
  VkImage in_stack_fffffffffffffb18;
  VkCommandBuffer in_stack_fffffffffffffb20;
  undefined1 in_stack_fffffffffffffb30 [72];
  undefined1 in_stack_fffffffffffffb8c [12];
  undefined8 in_stack_fffffffffffffb98;
  undefined8 in_stack_fffffffffffffba0;
  VkCommandBuffer pVVar11;
  undefined4 in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  undefined4 uVar12;
  undefined8 in_stack_fffffffffffffbb0;
  undefined8 uVar13;
  undefined8 in_stack_fffffffffffffbb8;
  VkCommandBuffer pVVar14;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  undefined8 in_stack_fffffffffffffbc8;
  undefined8 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd8;
  uint in_stack_fffffffffffffbdc;
  uint in_stack_fffffffffffffbe0;
  uint in_stack_fffffffffffffbe4;
  uint in_stack_fffffffffffffbe8;
  int iVar15;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 uVar16;
  undefined4 in_stack_fffffffffffffbf4;
  undefined4 uVar17;
  undefined4 in_stack_fffffffffffffbf8;
  uint uVar18;
  undefined4 in_stack_fffffffffffffbfc;
  undefined4 uVar19;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc04;
  ulong in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc10;
  PFN_vkWaitForFences in_stack_fffffffffffffc18;
  VkImageSubresourceRange in_stack_fffffffffffffc20;
  VkImageLayout in_stack_fffffffffffffc70;
  VkFilter in_stack_fffffffffffffc74;
  ktxVulkanDeviceInfo *in_stack_fffffffffffffc78;
  ktxVulkanTexture *in_stack_fffffffffffffc80;
  void *pvStack_2e8;
  int *local_2e0;
  VkSubmitInfo local_2d8;
  VkFence local_290;
  VkDeviceMemory local_288;
  VkImage local_280;
  ulong local_278;
  ulong local_270;
  long local_268;
  VkBufferImageCopy *local_260;
  undefined8 local_258;
  int local_250;
  int local_24c;
  void *local_248;
  ktx_uint32_t local_240;
  int local_23c;
  uint local_234;
  void *local_230;
  VkSubmitInfo local_228;
  VkFenceCreateInfo local_1e0;
  VkFence local_1c8;
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  int iStack_1b8;
  undefined4 uStack_1b4;
  uint32_t local_1b0;
  VkBufferCreateInfo local_1a8;
  VkDeviceSize local_170;
  VkBufferImageCopy *local_168;
  VkDeviceMemory local_160;
  VkBuffer local_158;
  ktx_uint32_t local_150;
  ktx_uint32_t local_14c;
  uint local_148;
  uint local_144;
  VkFormatProperties local_140;
  uint local_134;
  byte local_12e;
  byte local_12d;
  ktx_uint32_t local_12c;
  uint local_128;
  uint32_t local_124;
  VkMemoryRequirements local_120;
  VkMemoryAllocateInfo local_108;
  VkImageCreateInfo local_e8;
  VkCommandBufferBeginInfo local_90;
  VkResult local_6c;
  VkImageFormatProperties local_68;
  VkImageCreateFlags local_44;
  undefined4 local_40;
  VkImageType local_3c;
  VkFormat local_38;
  uint local_34;
  ktx_error_code_e local_30;
  undefined4 local_2c;
  uint local_28;
  VkImageTiling local_24;
  undefined8 *local_20;
  ktxVulkanDeviceInfo *local_18;
  int *local_10;
  ktx_error_code_e local_4;
  
  bVar9 = 0;
  local_34 = 1;
  local_44 = 0;
  local_90.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  local_90._4_4_ = 0;
  local_90.pNext = (void *)0x0;
  local_90.flags = 0;
  local_90._20_4_ = 0;
  local_90.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  local_2c = in_R9D;
  local_28 = in_R8D;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_e8,0,0x58);
  local_e8.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_108.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
  local_108._4_4_ = 0;
  local_108.pNext = (void *)0x0;
  local_108.allocationSize = 0;
  local_108.memoryTypeIndex = 0;
  local_108._28_4_ = 0;
  local_12c = ktxTexture_GetElementSize((ktxTexture *)0x482238);
  local_12e = 0;
  if (in_stack_00000008 != (long *)0x0) {
    if (((((*in_stack_00000008 == 0) || (in_stack_00000008[1] == 0)) || (in_stack_00000008[2] == 0))
        || ((in_stack_00000008[3] == 0 || (in_stack_00000008[4] == 0)))) ||
       (in_stack_00000008[5] == 0)) {
      return KTX_INVALID_VALUE;
    }
    local_12e = 1;
  }
  if (((local_18 == (ktxVulkanDeviceInfo *)0x0) || (local_10 == (int *)0x0)) ||
     (local_20 == (undefined8 *)0x0)) {
    local_4 = KTX_INVALID_VALUE;
  }
  else if ((*(long *)(local_10 + 0x1c) != 0) ||
          (kVar1 = ktxTexture_isActiveStream(in_stack_fffffffffffffa90), kVar1)) {
    if ((local_10[0xf] == 6) && (local_10[0xc] != 2)) {
      __assert_fail("This->numFaces == 6 ? This->numDimensions == 2 : VK_TRUE",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                    ,0x366,
                    "ktx_error_code_e ktxTexture_VkUploadEx_WithSuballocator(ktxTexture *, ktxVulkanDeviceInfo *, ktxVulkanTexture *, VkImageTiling, VkImageUsageFlags, VkImageLayout, ktxVulkanTexture_subAllocatorCallbacks *)"
                   );
    }
    local_124 = local_10[0xe];
    if ((*(byte *)((long)local_10 + 0x21) & 1) != 0) {
      local_124 = local_124 * 6;
      local_44 = 0x10;
    }
    if ((local_10[0xc] == 0) || (3 < (uint)local_10[0xc])) {
      __assert_fail("This->numDimensions >= 1 && This->numDimensions <= 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                    ,0x36e,
                    "ktx_error_code_e ktxTexture_VkUploadEx_WithSuballocator(ktxTexture *, ktxVulkanDeviceInfo *, ktxVulkanTexture *, VkImageTiling, VkImageUsageFlags, VkImageLayout, ktxVulkanTexture_subAllocatorCallbacks *)"
                   );
    }
    iVar15 = local_10[0xc];
    if (iVar15 == 1) {
      local_3c = VK_IMAGE_TYPE_1D;
      local_40 = 0;
      if ((*(byte *)(local_10 + 8) & 1) != 0) {
        local_40 = 4;
      }
    }
    else if ((iVar15 == 2) || (iVar15 != 3)) {
      local_3c = VK_IMAGE_TYPE_2D;
      if ((*(byte *)((long)local_10 + 0x21) & 1) == 0) {
        local_40 = 1;
        if ((*(byte *)(local_10 + 8) & 1) != 0) {
          local_40 = 5;
        }
      }
      else {
        local_40 = 3;
        if ((*(byte *)(local_10 + 8) & 1) != 0) {
          local_40 = 6;
        }
      }
    }
    else {
      local_3c = VK_IMAGE_TYPE_3D;
      if ((*(byte *)(local_10 + 8) & 1) != 0) {
        __assert_fail("!This->isArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                      ,900,
                      "ktx_error_code_e ktxTexture_VkUploadEx_WithSuballocator(ktxTexture *, ktxVulkanDeviceInfo *, ktxVulkanTexture *, VkImageTiling, VkImageUsageFlags, VkImageLayout, ktxVulkanTexture_subAllocatorCallbacks *)"
                     );
      }
      local_40 = 2;
    }
    local_38 = ktxTexture_GetVkFormat(in_stack_fffffffffffffa88);
    if (local_38 == VK_FORMAT_UNDEFINED) {
      local_4 = KTX_INVALID_OPERATION;
    }
    else {
      if (local_24 == VK_IMAGE_TILING_OPTIMAL) {
        local_28 = local_28 | 2;
      }
      if ((*(byte *)((long)local_10 + 0x23) & 1) != 0) {
        local_28 = local_28 | 3;
      }
      local_6c = (*(local_18->vkFuncs).vkGetPhysicalDeviceImageFormatProperties)
                           (local_18->physicalDevice,local_38,local_3c,local_24,local_28,local_44,
                            &local_68);
      if (local_6c == VK_ERROR_FORMAT_NOT_SUPPORTED) {
        local_4 = KTX_INVALID_OPERATION;
      }
      else if (local_68.maxArrayLayers < (uint)local_10[0xe]) {
        local_4 = KTX_INVALID_OPERATION;
      }
      else {
        if ((*(byte *)((long)local_10 + 0x23) & 1) == 0) {
          local_128 = local_10[0xd];
        }
        else {
          local_148 = 0xc00;
          (*(local_18->vkFuncs).vkGetPhysicalDeviceFormatProperties)
                    (local_18->physicalDevice,local_38,&local_140);
          if (local_6c != VK_SUCCESS) {
            __assert_fail("vResult == VK_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                          ,0x3ae,
                          "ktx_error_code_e ktxTexture_VkUploadEx_WithSuballocator(ktxTexture *, ktxVulkanDeviceInfo *, ktxVulkanTexture *, VkImageTiling, VkImageUsageFlags, VkImageLayout, ktxVulkanTexture_subAllocatorCallbacks *)"
                         );
          }
          if (local_24 == VK_IMAGE_TILING_OPTIMAL) {
            local_144 = local_140.optimalTilingFeatures;
          }
          else {
            local_144 = local_140.linearTilingFeatures;
          }
          if ((local_144 & local_148) != local_148) {
            return KTX_INVALID_OPERATION;
          }
          local_34 = (uint)((local_144 & 0x1000) != 0);
          if ((uint)local_10[10] < (uint)local_10[9]) {
            in_stack_fffffffffffffbe8 = local_10[9];
          }
          else {
            in_stack_fffffffffffffbe8 = local_10[10];
          }
          if ((uint)local_10[0xb] < in_stack_fffffffffffffbe8) {
            if ((uint)local_10[10] < (uint)local_10[9]) {
              in_stack_fffffffffffffbe0 = local_10[9];
              in_stack_fffffffffffffbe4 = in_stack_fffffffffffffbe0;
            }
            else {
              in_stack_fffffffffffffbe0 = local_10[10];
              in_stack_fffffffffffffbe4 = in_stack_fffffffffffffbe0;
            }
          }
          else {
            in_stack_fffffffffffffbe0 = local_10[0xb];
          }
          local_134 = in_stack_fffffffffffffbe0;
          auVar10._0_8_ = log2((double)in_stack_fffffffffffffbe0);
          auVar10._8_8_ = extraout_XMM0_Qb;
          auVar10 = roundsd(auVar10,auVar10,9);
          local_128 = (int)(long)auVar10._0_8_ + 1;
        }
        if (local_68.maxMipLevels < local_128) {
          local_4 = KTX_INVALID_OPERATION;
        }
        else {
          if (*local_10 == 2) {
            local_12d = 1;
          }
          else {
            local_14c = ktxTexture_GetRowPitch(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
            local_150 = local_12c * local_10[9];
            if (((local_12c & 3) == 0) || ((local_10[0xd] == 1 && (local_14c == local_150)))) {
              local_12d = 1;
            }
            else {
              local_12d = 0;
            }
          }
          *(int *)((long)local_20 + 0x2c) = local_10[9];
          *(int *)(local_20 + 6) = local_10[10];
          *(int *)((long)local_20 + 0x34) = local_10[0xb];
          *(undefined4 *)((long)local_20 + 0x1c) = local_2c;
          *(VkFormat *)(local_20 + 3) = local_38;
          *(uint *)(local_20 + 7) = local_128;
          *(uint32_t *)((long)local_20 + 0x3c) = local_124;
          *(undefined4 *)(local_20 + 5) = local_40;
          *local_20 = (local_18->vkFuncs).vkDestroyImage;
          local_20[1] = (local_18->vkFuncs).vkFreeMemory;
          (*(local_18->vkFuncs).vkBeginCommandBuffer)(local_18->cmdBuffer,&local_90);
          if (local_24 == VK_IMAGE_TILING_OPTIMAL) {
            local_160 = (VkDeviceMemory)0x0;
            memset(&local_1a8,0,0x38);
            local_1a8.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
            local_1e0.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
            local_1e0._4_4_ = 0;
            local_1e0.pNext = (void *)0x0;
            local_1e0.flags = 0;
            local_1e0._20_4_ = 0;
            memset(&local_228,0,0x48);
            local_228.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
            local_170 = (**(code **)(*(long *)(local_10 + 2) + 0x10))(local_10);
            if ((local_12d & 1) == 0) {
              if ((*(byte *)(local_10 + 8) & 1) == 0) {
                in_stack_fffffffffffffbdc = local_10[0xd] * local_10[0xf];
              }
              else {
                in_stack_fffffffffffffbdc = local_10[0xd];
              }
              local_1a8.size = in_stack_fffffffffffffbdc * local_12c * 4 + local_170;
              local_234 = in_stack_fffffffffffffbdc;
            }
            else {
              local_234 = local_10[0xd];
              local_1a8.size = local_170;
            }
            local_168 = (VkBufferImageCopy *)malloc((ulong)local_234 * 0x38);
            if (local_168 == (VkBufferImageCopy *)0x0) {
              return KTX_OUT_OF_MEMORY;
            }
            local_1a8.usage = 1;
            local_1a8.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
            (*(local_18->vkFuncs).vkCreateBuffer)
                      (local_18->device,&local_1a8,local_18->pAllocator,&local_158);
            (*(local_18->vkFuncs).vkGetBufferMemoryRequirements)
                      (local_18->device,local_158,&local_120);
            local_108.allocationSize = local_120.size;
            uVar2 = ktxVulkanDeviceInfo_getMemoryType(local_18,local_120.memoryTypeBits,6);
            local_108.memoryTypeIndex = uVar2;
            local_268 = 0;
            if ((local_12e & 1) == 0) {
              local_6c = (*(local_18->vkFuncs).vkAllocateMemory)
                                   (local_18->device,&local_108,local_18->pAllocator,&local_160);
              if (local_6c != VK_SUCCESS) {
                free(local_168);
                return KTX_OUT_OF_MEMORY;
              }
              (*(local_18->vkFuncs).vkBindBufferMemory)(local_18->device,local_158,local_160,0);
              (*(local_18->vkFuncs).vkMapMemory)
                        (local_18->device,local_160,0,local_120.size,0,&local_230);
            }
            else {
              local_270 = 0;
              local_268 = (*(code *)*in_stack_00000008)(&local_108,&local_120,&local_270);
              if (local_268 == 0) {
                free(local_168);
                return KTX_OUT_OF_MEMORY;
              }
              if (1 < local_270) {
                free(local_168);
                return KTX_UNSUPPORTED_FEATURE;
              }
              (*(code *)in_stack_00000008[1])(local_158,local_268);
              (*(code *)in_stack_00000008[3])(local_268,0,&local_120,&local_230);
            }
            local_258 = 0;
            local_260 = local_168;
            local_250 = local_10[0xf];
            local_24c = local_10[0xe];
            local_248 = local_230;
            local_240 = local_12c;
            local_23c = local_10[0xc];
            if ((local_12d & 1) == 0) {
              if (*(long *)(local_10 + 0x1c) == 0) {
                local_30 = (**(code **)(*(long *)(local_10 + 2) + 0x30))
                                     (local_10,optimalTilingPadCallback,&local_260);
              }
              else {
                local_30 = ktxTexture_IterateLevelFaces
                                     (in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                                      in_stack_fffffffffffffac8);
              }
            }
            else {
              if (*(long *)(local_10 + 0x1c) == 0) {
                kVar3 = (**(code **)(*(long *)(local_10 + 2) + 0x40))
                                  (local_10,local_230,local_108.allocationSize);
                if (kVar3 != KTX_SUCCESS) {
                  return kVar3;
                }
                local_30 = 0;
              }
              else {
                if (local_108.allocationSize < *(ulong *)(local_10 + 0x1a)) {
                  __assert_fail("This->dataSize <= memAllocInfo.allocationSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                                ,0x474,
                                "ktx_error_code_e ktxTexture_VkUploadEx_WithSuballocator(ktxTexture *, ktxVulkanDeviceInfo *, ktxVulkanTexture *, VkImageTiling, VkImageUsageFlags, VkImageLayout, ktxVulkanTexture_subAllocatorCallbacks *)"
                               );
                }
                memcpy(local_230,*(void **)(local_10 + 0x1c),*(size_t *)(local_10 + 0x1a));
              }
              local_30 = (**(code **)(*(long *)(local_10 + 2) + 0x28))
                                   (local_10,optimalTilingCallback,&local_260);
            }
            if ((local_12e & 1) == 0) {
              (*(local_18->vkFuncs).vkUnmapMemory)(local_18->device,local_160);
            }
            else {
              (*(code *)in_stack_00000008[4])(local_268,0);
            }
            local_e8.imageType = local_3c;
            local_e8.flags = local_44;
            local_e8.format = local_38;
            local_e8.mipLevels = local_128;
            local_e8.arrayLayers = local_124;
            local_e8.samples = VK_SAMPLE_COUNT_1_BIT;
            local_e8.tiling = VK_IMAGE_TILING_OPTIMAL;
            local_e8.usage = local_28;
            local_e8.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
            local_e8.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
            local_e8.extent.width = *(uint32_t *)((long)local_20 + 0x2c);
            local_e8.extent.height = *(uint32_t *)(local_20 + 6);
            local_e8.extent.depth = *(uint32_t *)((long)local_20 + 0x34);
            (*(local_18->vkFuncs).vkCreateImage)
                      (local_18->device,&local_e8,local_18->pAllocator,(VkImage *)(local_20 + 2));
            (*(local_18->vkFuncs).vkGetImageMemoryRequirements)
                      (local_18->device,(VkImage)local_20[2],&local_120);
            local_108.allocationSize = local_120.size;
            uVar2 = ktxVulkanDeviceInfo_getMemoryType(local_18,local_120.memoryTypeBits,1);
            local_108.memoryTypeIndex = uVar2;
            if ((local_12e & 1) == 0) {
              (*(local_18->vkFuncs).vkAllocateMemory)
                        (local_18->device,&local_108,local_18->pAllocator,
                         (VkDeviceMemory *)(local_20 + 4));
              (*(local_18->vkFuncs).vkBindImageMemory)
                        (local_18->device,(VkImage)local_20[2],(VkDeviceMemory)local_20[4],0);
            }
            else {
              local_278 = 0;
              uVar4 = (*(code *)*in_stack_00000008)(&local_108,&local_120,&local_278);
              local_20[8] = uVar4;
              if (local_20[8] == 0) {
                return KTX_OUT_OF_MEMORY;
              }
              if (1 < local_278) {
                return KTX_UNSUPPORTED_FEATURE;
              }
              (*(code *)in_stack_00000008[2])(local_20[2],local_20[8]);
            }
            local_1c0 = 1;
            uStack_1bc = 0;
            iStack_1b8 = local_10[0xd];
            uStack_1b4 = 0;
            local_1b0 = local_124;
            pVVar11 = local_18->cmdBuffer;
            uVar4 = local_20[2];
            pkVar7 = &local_18->vkFuncs;
            puVar8 = (undefined8 *)&stack0xfffffffffffffa88;
            for (lVar6 = 0x1e; lVar6 != 0; lVar6 = lVar6 + -1) {
              *puVar8 = pkVar7->vkGetInstanceProcAddr;
              pkVar7 = (ktxVulkanFunctions *)((long)pkVar7 + (ulong)bVar9 * -0x10 + 8);
              puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
            }
            vkFuncs.vkCmdPipelineBarrier._4_4_ = uStack_1bc;
            vkFuncs.vkCmdPipelineBarrier._0_4_ = local_1c0;
            vkFuncs.vkCreateImage._4_4_ = uStack_1b4;
            vkFuncs.vkCreateImage._0_4_ = iStack_1b8;
            vkFuncs.vkGetInstanceProcAddr =
                 (PFN_vkGetInstanceProcAddr)in_stack_fffffffffffffb30._0_8_;
            vkFuncs.vkGetDeviceProcAddr = (PFN_vkGetDeviceProcAddr)in_stack_fffffffffffffb30._8_8_;
            vkFuncs.vkAllocateCommandBuffers =
                 (PFN_vkAllocateCommandBuffers)in_stack_fffffffffffffb30._16_8_;
            vkFuncs.vkAllocateMemory = (PFN_vkAllocateMemory)in_stack_fffffffffffffb30._24_8_;
            vkFuncs.vkBeginCommandBuffer =
                 (PFN_vkBeginCommandBuffer)in_stack_fffffffffffffb30._32_8_;
            vkFuncs.vkBindBufferMemory = (PFN_vkBindBufferMemory)in_stack_fffffffffffffb30._40_8_;
            vkFuncs.vkBindImageMemory = (PFN_vkBindImageMemory)in_stack_fffffffffffffb30._48_8_;
            vkFuncs.vkCmdBlitImage = (PFN_vkCmdBlitImage)in_stack_fffffffffffffb30._56_8_;
            vkFuncs.vkCmdCopyBufferToImage =
                 (PFN_vkCmdCopyBufferToImage)in_stack_fffffffffffffb30._64_8_;
            vkFuncs.vkDestroyImage._0_4_ = local_1b0;
            vkFuncs._92_12_ = in_stack_fffffffffffffb8c;
            vkFuncs.vkDestroyBuffer = (PFN_vkDestroyBuffer)in_stack_fffffffffffffb98;
            vkFuncs.vkCreateFence = (PFN_vkCreateFence)in_stack_fffffffffffffba0;
            vkFuncs.vkDestroyFence._0_4_ = in_stack_fffffffffffffba8;
            vkFuncs.vkDestroyFence._4_4_ = in_stack_fffffffffffffbac;
            vkFuncs.vkEndCommandBuffer = (PFN_vkEndCommandBuffer)in_stack_fffffffffffffbb0;
            vkFuncs.vkFreeCommandBuffers = (PFN_vkFreeCommandBuffers)in_stack_fffffffffffffbb8;
            vkFuncs.vkFreeMemory._0_4_ = in_stack_fffffffffffffbc0;
            vkFuncs.vkFreeMemory._4_4_ = in_stack_fffffffffffffbc4;
            vkFuncs.vkGetBufferMemoryRequirements = (PFN_vkGetBufferMemoryRequirements)uVar4;
            vkFuncs.vkGetImageMemoryRequirements = (PFN_vkGetImageMemoryRequirements)pVVar11;
            vkFuncs.vkGetImageSubresourceLayout._0_4_ = in_stack_fffffffffffffbd8;
            vkFuncs.vkGetImageSubresourceLayout._4_4_ = in_stack_fffffffffffffbdc;
            vkFuncs.vkGetPhysicalDeviceImageFormatProperties._0_4_ = in_stack_fffffffffffffbe0;
            vkFuncs.vkGetPhysicalDeviceImageFormatProperties._4_4_ = in_stack_fffffffffffffbe4;
            vkFuncs.vkGetPhysicalDeviceFormatProperties._0_4_ = in_stack_fffffffffffffbe8;
            vkFuncs.vkGetPhysicalDeviceFormatProperties._4_4_ = iVar15;
            vkFuncs.vkGetPhysicalDeviceMemoryProperties._0_4_ = in_stack_fffffffffffffbf0;
            vkFuncs.vkGetPhysicalDeviceMemoryProperties._4_4_ = in_stack_fffffffffffffbf4;
            vkFuncs.vkMapMemory._0_4_ = in_stack_fffffffffffffbf8;
            vkFuncs.vkMapMemory._4_4_ = in_stack_fffffffffffffbfc;
            vkFuncs.vkQueueSubmit._0_4_ = in_stack_fffffffffffffc00;
            vkFuncs.vkQueueSubmit._4_4_ = in_stack_fffffffffffffc04;
            vkFuncs.vkQueueWaitIdle = (PFN_vkQueueWaitIdle)in_stack_fffffffffffffc08;
            vkFuncs.vkUnmapMemory = (PFN_vkUnmapMemory)in_stack_fffffffffffffc10;
            vkFuncs.vkWaitForFences = in_stack_fffffffffffffc18;
            setImageLayout(vkFuncs,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
                           in_stack_fffffffffffffb14,in_stack_fffffffffffffb10,
                           in_stack_fffffffffffffc20);
            (*(local_18->vkFuncs).vkCmdCopyBufferToImage)
                      (local_18->cmdBuffer,local_158,(VkImage)local_20[2],
                       VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,local_234,local_168);
            free(local_168);
            if ((*(byte *)((long)local_10 + 0x23) & 1) == 0) {
              pVVar14 = local_18->cmdBuffer;
              uVar13 = local_20[2];
              pkVar7 = &local_18->vkFuncs;
              puVar8 = (undefined8 *)&stack0xfffffffffffffa88;
              uVar12 = local_2c;
              for (lVar6 = 0x1e; lVar6 != 0; lVar6 = lVar6 + -1) {
                *puVar8 = pkVar7->vkGetInstanceProcAddr;
                pkVar7 = (ktxVulkanFunctions *)((long)pkVar7 + (ulong)bVar9 * -0x10 + 8);
                puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
              }
              vkFuncs_00.vkCmdPipelineBarrier._4_4_ = uStack_1bc;
              vkFuncs_00.vkCmdPipelineBarrier._0_4_ = local_1c0;
              vkFuncs_00.vkCreateImage._4_4_ = uStack_1b4;
              vkFuncs_00.vkCreateImage._0_4_ = iStack_1b8;
              vkFuncs_00.vkGetInstanceProcAddr =
                   (PFN_vkGetInstanceProcAddr)in_stack_fffffffffffffb30._0_8_;
              vkFuncs_00.vkGetDeviceProcAddr =
                   (PFN_vkGetDeviceProcAddr)in_stack_fffffffffffffb30._8_8_;
              vkFuncs_00.vkAllocateCommandBuffers =
                   (PFN_vkAllocateCommandBuffers)in_stack_fffffffffffffb30._16_8_;
              vkFuncs_00.vkAllocateMemory = (PFN_vkAllocateMemory)in_stack_fffffffffffffb30._24_8_;
              vkFuncs_00.vkBeginCommandBuffer =
                   (PFN_vkBeginCommandBuffer)in_stack_fffffffffffffb30._32_8_;
              vkFuncs_00.vkBindBufferMemory =
                   (PFN_vkBindBufferMemory)in_stack_fffffffffffffb30._40_8_;
              vkFuncs_00.vkBindImageMemory = (PFN_vkBindImageMemory)in_stack_fffffffffffffb30._48_8_
              ;
              vkFuncs_00.vkCmdBlitImage = (PFN_vkCmdBlitImage)in_stack_fffffffffffffb30._56_8_;
              vkFuncs_00.vkCmdCopyBufferToImage =
                   (PFN_vkCmdCopyBufferToImage)in_stack_fffffffffffffb30._64_8_;
              vkFuncs_00.vkDestroyImage._0_4_ = local_1b0;
              vkFuncs_00._92_12_ = in_stack_fffffffffffffb8c;
              vkFuncs_00.vkDestroyBuffer = (PFN_vkDestroyBuffer)in_stack_fffffffffffffb98;
              vkFuncs_00.vkCreateFence = (PFN_vkCreateFence)in_stack_fffffffffffffba0;
              vkFuncs_00.vkDestroyFence._0_4_ = in_stack_fffffffffffffba8;
              vkFuncs_00.vkDestroyFence._4_4_ = in_stack_fffffffffffffbac;
              vkFuncs_00.vkEndCommandBuffer = (PFN_vkEndCommandBuffer)uVar13;
              vkFuncs_00.vkFreeCommandBuffers = (PFN_vkFreeCommandBuffers)pVVar14;
              vkFuncs_00.vkFreeMemory._0_4_ = in_stack_fffffffffffffbc0;
              vkFuncs_00.vkFreeMemory._4_4_ = uVar12;
              vkFuncs_00.vkGetBufferMemoryRequirements = (PFN_vkGetBufferMemoryRequirements)uVar4;
              vkFuncs_00.vkGetImageMemoryRequirements = (PFN_vkGetImageMemoryRequirements)pVVar11;
              vkFuncs_00.vkGetImageSubresourceLayout._0_4_ = in_stack_fffffffffffffbd8;
              vkFuncs_00.vkGetImageSubresourceLayout._4_4_ = in_stack_fffffffffffffbdc;
              vkFuncs_00.vkGetPhysicalDeviceImageFormatProperties._0_4_ = in_stack_fffffffffffffbe0;
              vkFuncs_00.vkGetPhysicalDeviceImageFormatProperties._4_4_ = in_stack_fffffffffffffbe4;
              vkFuncs_00.vkGetPhysicalDeviceFormatProperties._0_4_ = in_stack_fffffffffffffbe8;
              vkFuncs_00.vkGetPhysicalDeviceFormatProperties._4_4_ = iVar15;
              vkFuncs_00.vkGetPhysicalDeviceMemoryProperties._0_4_ = in_stack_fffffffffffffbf0;
              vkFuncs_00.vkGetPhysicalDeviceMemoryProperties._4_4_ = in_stack_fffffffffffffbf4;
              vkFuncs_00.vkMapMemory._0_4_ = in_stack_fffffffffffffbf8;
              vkFuncs_00.vkMapMemory._4_4_ = in_stack_fffffffffffffbfc;
              vkFuncs_00.vkQueueSubmit._0_4_ = in_stack_fffffffffffffc00;
              vkFuncs_00.vkQueueSubmit._4_4_ = in_stack_fffffffffffffc04;
              vkFuncs_00.vkQueueWaitIdle = (PFN_vkQueueWaitIdle)in_stack_fffffffffffffc08;
              vkFuncs_00.vkUnmapMemory = (PFN_vkUnmapMemory)in_stack_fffffffffffffc10;
              vkFuncs_00.vkWaitForFences = in_stack_fffffffffffffc18;
              setImageLayout(vkFuncs_00,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
                             in_stack_fffffffffffffb14,in_stack_fffffffffffffb10,
                             in_stack_fffffffffffffc20);
            }
            else {
              generateMipmaps(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                              in_stack_fffffffffffffc74,in_stack_fffffffffffffc70);
            }
            (*(local_18->vkFuncs).vkEndCommandBuffer)(local_18->cmdBuffer);
            (*(local_18->vkFuncs).vkCreateFence)
                      (local_18->device,&local_1e0,local_18->pAllocator,&local_1c8);
            local_228.commandBufferCount = 1;
            local_228.pCommandBuffers = &local_18->cmdBuffer;
            (*(local_18->vkFuncs).vkQueueSubmit)(local_18->queue,1,&local_228,local_1c8);
            (*(local_18->vkFuncs).vkWaitForFences)(local_18->device,1,&local_1c8,1,100000000000);
            (*(local_18->vkFuncs).vkDestroyFence)(local_18->device,local_1c8,local_18->pAllocator);
            if ((local_12e & 1) == 0) {
              (*(local_18->vkFuncs).vkFreeMemory)(local_18->device,local_160,local_18->pAllocator);
            }
            else {
              (*(code *)in_stack_00000008[5])(local_268);
            }
            (*(local_18->vkFuncs).vkDestroyBuffer)(local_18->device,local_158,local_18->pAllocator);
          }
          else {
            local_288 = (VkDeviceMemory)0x0;
            local_290 = (VkFence)0x0;
            memset(&local_2d8,0,0x48);
            local_2d8.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
            local_e8.imageType = local_3c;
            local_e8.flags = local_44;
            local_e8.format = local_38;
            local_e8.extent.width = *(uint32_t *)((long)local_20 + 0x2c);
            local_e8.extent.height = *(uint32_t *)(local_20 + 6);
            local_e8.extent.depth = *(uint32_t *)((long)local_20 + 0x34);
            local_e8.mipLevels = local_128;
            local_e8.arrayLayers = local_124;
            local_e8.samples = VK_SAMPLE_COUNT_1_BIT;
            local_e8.tiling = VK_IMAGE_TILING_LINEAR;
            local_e8.usage = local_28;
            local_e8.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
            local_e8.initialLayout = VK_IMAGE_LAYOUT_PREINITIALIZED;
            (*(local_18->vkFuncs).vkCreateImage)
                      (local_18->device,&local_e8,local_18->pAllocator,&local_280);
            (*(local_18->vkFuncs).vkGetImageMemoryRequirements)
                      (local_18->device,local_280,&local_120);
            local_108.allocationSize = local_120.size;
            uVar2 = ktxVulkanDeviceInfo_getMemoryType(local_18,local_120.memoryTypeBits,6);
            local_108.memoryTypeIndex = uVar2;
            if ((local_12e & 1) == 0) {
              local_6c = (*(local_18->vkFuncs).vkAllocateMemory)
                                   (local_18->device,&local_108,local_18->pAllocator,&local_288);
              if (local_6c != VK_SUCCESS) {
                return KTX_OUT_OF_MEMORY;
              }
              (*(local_18->vkFuncs).vkBindImageMemory)(local_18->device,local_280,local_288,0);
            }
            else {
              in_stack_fffffffffffffc08 = 0;
              uVar4 = (*(code *)*in_stack_00000008)(&local_108,&local_120,&stack0xfffffffffffffc08);
              local_20[8] = uVar4;
              if (local_20[8] == 0) {
                return KTX_OUT_OF_MEMORY;
              }
              if (1 < in_stack_fffffffffffffc08) {
                return KTX_UNSUPPORTED_FEATURE;
              }
              (*(code *)in_stack_00000008[2])(local_280,local_20[8]);
            }
            memcpy(&stack0xfffffffffffffc18,&local_18->vkFuncs,0xf0);
            local_2e0 = local_10;
            pcVar5 = linearTilingPadCallback;
            if ((local_12d & 1) != 0) {
              pcVar5 = linearTilingCallback;
            }
            if ((local_12e & 1) == 0) {
              (*(local_18->vkFuncs).vkMapMemory)
                        (local_18->device,local_288,0,local_120.size,0,&pvStack_2e8);
            }
            else {
              (*(code *)in_stack_00000008[3])(local_20[8],0,&local_120,&pvStack_2e8);
            }
            kVar1 = ktxTexture_isActiveStream(in_stack_fffffffffffffa90);
            if (kVar1) {
              local_30 = (**(code **)(*(long *)(local_10 + 2) + 0x30))
                                   (local_10,pcVar5,&stack0xfffffffffffffc18);
            }
            else {
              local_30 = ktxTexture_IterateLevelFaces
                                   (in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                                    in_stack_fffffffffffffac8);
            }
            if ((local_12e & 1) == 0) {
              (*(local_18->vkFuncs).vkUnmapMemory)(local_18->device,local_288);
            }
            else {
              (*(code *)in_stack_00000008[4])(local_20[8],0);
            }
            local_20[2] = local_280;
            if ((local_12e & 1) == 0) {
              local_20[4] = local_288;
            }
            if ((*(byte *)((long)local_10 + 0x23) & 1) == 0) {
              uVar16 = 1;
              uVar17 = 0;
              uVar19 = 0;
              pVVar11 = local_18->cmdBuffer;
              uVar4 = local_20[2];
              pkVar7 = &local_18->vkFuncs;
              puVar8 = (undefined8 *)&stack0xfffffffffffffa88;
              uVar12 = local_2c;
              uVar18 = local_128;
              uVar2 = local_124;
              for (lVar6 = 0x1e; lVar6 != 0; lVar6 = lVar6 + -1) {
                *puVar8 = pkVar7->vkGetInstanceProcAddr;
                pkVar7 = (ktxVulkanFunctions *)((long)pkVar7 + (ulong)bVar9 * -0x10 + 8);
                puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
              }
              vkFuncs_01.vkCmdPipelineBarrier._4_4_ = uVar17;
              vkFuncs_01.vkCmdPipelineBarrier._0_4_ = uVar16;
              vkFuncs_01.vkCreateImage._4_4_ = uVar19;
              vkFuncs_01.vkCreateImage._0_4_ = uVar18;
              vkFuncs_01.vkGetInstanceProcAddr =
                   (PFN_vkGetInstanceProcAddr)in_stack_fffffffffffffb30._0_8_;
              vkFuncs_01.vkGetDeviceProcAddr =
                   (PFN_vkGetDeviceProcAddr)in_stack_fffffffffffffb30._8_8_;
              vkFuncs_01.vkAllocateCommandBuffers =
                   (PFN_vkAllocateCommandBuffers)in_stack_fffffffffffffb30._16_8_;
              vkFuncs_01.vkAllocateMemory = (PFN_vkAllocateMemory)in_stack_fffffffffffffb30._24_8_;
              vkFuncs_01.vkBeginCommandBuffer =
                   (PFN_vkBeginCommandBuffer)in_stack_fffffffffffffb30._32_8_;
              vkFuncs_01.vkBindBufferMemory =
                   (PFN_vkBindBufferMemory)in_stack_fffffffffffffb30._40_8_;
              vkFuncs_01.vkBindImageMemory = (PFN_vkBindImageMemory)in_stack_fffffffffffffb30._48_8_
              ;
              vkFuncs_01.vkCmdBlitImage = (PFN_vkCmdBlitImage)in_stack_fffffffffffffb30._56_8_;
              vkFuncs_01.vkCmdCopyBufferToImage =
                   (PFN_vkCmdCopyBufferToImage)in_stack_fffffffffffffb30._64_8_;
              vkFuncs_01.vkDestroyImage._0_4_ = uVar2;
              vkFuncs_01._92_12_ = in_stack_fffffffffffffb8c;
              vkFuncs_01.vkDestroyBuffer = (PFN_vkDestroyBuffer)uVar4;
              vkFuncs_01.vkCreateFence = (PFN_vkCreateFence)pVVar11;
              vkFuncs_01.vkDestroyFence._0_4_ = in_stack_fffffffffffffba8;
              vkFuncs_01.vkDestroyFence._4_4_ = uVar12;
              vkFuncs_01.vkEndCommandBuffer = (PFN_vkEndCommandBuffer)in_stack_fffffffffffffbb0;
              vkFuncs_01.vkFreeCommandBuffers = (PFN_vkFreeCommandBuffers)in_stack_fffffffffffffbb8;
              vkFuncs_01.vkFreeMemory._0_4_ = in_stack_fffffffffffffbc0;
              vkFuncs_01.vkFreeMemory._4_4_ = in_stack_fffffffffffffbc4;
              vkFuncs_01.vkGetBufferMemoryRequirements =
                   (PFN_vkGetBufferMemoryRequirements)in_stack_fffffffffffffbc8;
              vkFuncs_01.vkGetImageMemoryRequirements =
                   (PFN_vkGetImageMemoryRequirements)in_stack_fffffffffffffbd0;
              vkFuncs_01.vkGetImageSubresourceLayout._0_4_ = in_stack_fffffffffffffbd8;
              vkFuncs_01.vkGetImageSubresourceLayout._4_4_ = in_stack_fffffffffffffbdc;
              vkFuncs_01.vkGetPhysicalDeviceImageFormatProperties._0_4_ = in_stack_fffffffffffffbe0;
              vkFuncs_01.vkGetPhysicalDeviceImageFormatProperties._4_4_ = in_stack_fffffffffffffbe4;
              vkFuncs_01.vkGetPhysicalDeviceFormatProperties._0_4_ = in_stack_fffffffffffffbe8;
              vkFuncs_01.vkGetPhysicalDeviceFormatProperties._4_4_ = iVar15;
              vkFuncs_01.vkGetPhysicalDeviceMemoryProperties._0_4_ = uVar16;
              vkFuncs_01.vkGetPhysicalDeviceMemoryProperties._4_4_ = uVar17;
              vkFuncs_01.vkMapMemory._0_4_ = uVar18;
              vkFuncs_01.vkMapMemory._4_4_ = uVar19;
              vkFuncs_01.vkQueueSubmit._0_4_ = uVar2;
              vkFuncs_01.vkQueueSubmit._4_4_ = in_stack_fffffffffffffc04;
              vkFuncs_01.vkQueueWaitIdle = (PFN_vkQueueWaitIdle)in_stack_fffffffffffffc08;
              vkFuncs_01.vkUnmapMemory = pcVar5;
              vkFuncs_01.vkWaitForFences = in_stack_fffffffffffffc18;
              setImageLayout(vkFuncs_01,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
                             in_stack_fffffffffffffb14,in_stack_fffffffffffffb10,
                             in_stack_fffffffffffffc20);
            }
            else {
              generateMipmaps(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                              in_stack_fffffffffffffc74,in_stack_fffffffffffffc70);
            }
            (*(local_18->vkFuncs).vkEndCommandBuffer)(local_18->cmdBuffer);
            local_2d8.waitSemaphoreCount = 0;
            local_2d8.commandBufferCount = 1;
            local_2d8.pCommandBuffers = &local_18->cmdBuffer;
            (*(local_18->vkFuncs).vkQueueSubmit)(local_18->queue,1,&local_2d8,local_290);
            (*(local_18->vkFuncs).vkQueueWaitIdle)(local_18->queue);
          }
          local_4 = KTX_SUCCESS;
        }
      }
    }
  }
  else {
    local_4 = KTX_INVALID_OPERATION;
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxTexture_VkUploadEx_WithSuballocator(ktxTexture* This, ktxVulkanDeviceInfo* vdi,
                                       ktxVulkanTexture* vkTexture,
                                       VkImageTiling tiling,
                                       VkImageUsageFlags usageFlags,
                                       VkImageLayout finalLayout,
                                       ktxVulkanTexture_subAllocatorCallbacks* subAllocatorCallbacks)
{
    KTX_error_code           kResult;
    VkFilter                 blitFilter = VK_FILTER_LINEAR;
    VkFormat                 vkFormat;
    VkImageType              imageType;
    VkImageViewType          viewType;
    VkImageCreateFlags       createFlags = 0;
    VkImageFormatProperties  imageFormatProperties;
    VkResult                 vResult;
    VkCommandBufferBeginInfo cmdBufBeginInfo = {
        .sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
        .pNext = NULL
    };
    VkImageCreateInfo        imageCreateInfo = {
         .sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,
         .pNext = NULL
    };
    VkMemoryAllocateInfo     memAllocInfo = {
        .sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,
        .pNext = NULL,
        .allocationSize = 0,
        .memoryTypeIndex = 0
    };
    VkMemoryRequirements     memReqs;
    ktx_uint32_t             numImageLayers, numImageLevels;
    ktx_uint32_t elementSize = ktxTexture_GetElementSize(This);
    ktx_bool_t               canUseFasterPath;
    ktx_bool_t               useSuballocator = false;
    if (subAllocatorCallbacks) {
        if (subAllocatorCallbacks->allocMemFuncPtr &&
            subAllocatorCallbacks->bindBufferFuncPtr &&
            subAllocatorCallbacks->bindImageFuncPtr &&
            subAllocatorCallbacks->memoryMapFuncPtr &&
            subAllocatorCallbacks->memoryUnmapFuncPtr &&
            subAllocatorCallbacks->freeMemFuncPtr)
            useSuballocator = true;
        else
            return KTX_INVALID_VALUE;
    }

    if (!vdi || !This || !vkTexture) {
        return KTX_INVALID_VALUE;
    }

    if (!This->pData && !ktxTexture_isActiveStream(This)) {
        /* Nothing to upload. */
        return KTX_INVALID_OPERATION;
    }

    /* _ktxCheckHeader should have caught this. */
    assert(This->numFaces == 6 ? This->numDimensions == 2 : VK_TRUE);

    numImageLayers = This->numLayers;
    if (This->isCubemap) {
        numImageLayers *= 6;
        createFlags = VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT;
    }

    assert(This->numDimensions >= 1 && This->numDimensions <= 3);
    switch (This->numDimensions) {
      case 1:
        imageType = VK_IMAGE_TYPE_1D;
        viewType = This->isArray ?
                        VK_IMAGE_VIEW_TYPE_1D_ARRAY : VK_IMAGE_VIEW_TYPE_1D;
        break;
      case 2:
      default: // To keep compilers happy.
        imageType = VK_IMAGE_TYPE_2D;
        if (This->isCubemap)
            viewType = This->isArray ?
                        VK_IMAGE_VIEW_TYPE_CUBE_ARRAY : VK_IMAGE_VIEW_TYPE_CUBE;
        else
            viewType = This->isArray ?
                        VK_IMAGE_VIEW_TYPE_2D_ARRAY : VK_IMAGE_VIEW_TYPE_2D;
        break;
      case 3:
        imageType = VK_IMAGE_TYPE_3D;
        /* 3D array textures not supported in Vulkan. Attempts to create or
         * load them should have been trapped long before this.
         */
        assert(!This->isArray);
        viewType = VK_IMAGE_VIEW_TYPE_3D;
        break;
    }

    vkFormat = ktxTexture_GetVkFormat(This);
    if (vkFormat == VK_FORMAT_UNDEFINED) {
        return KTX_INVALID_OPERATION;
    }

    /* Get device properties for the requested image format */
    if (tiling == VK_IMAGE_TILING_OPTIMAL) {
        // Ensure we can copy from staging buffer to image.
        usageFlags |= VK_IMAGE_USAGE_TRANSFER_DST_BIT;
    }
    if (This->generateMipmaps) {
        // Ensure we can blit between levels.
        usageFlags |= (VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT);
    }
    vResult = vdi->vkFuncs.vkGetPhysicalDeviceImageFormatProperties(vdi->physicalDevice,
                                                      vkFormat,
                                                      imageType,
                                                      tiling,
                                                      usageFlags,
                                                      createFlags,
                                                      &imageFormatProperties);
    if (vResult == VK_ERROR_FORMAT_NOT_SUPPORTED) {
        return KTX_INVALID_OPERATION;
    }
    if (This->numLayers > imageFormatProperties.maxArrayLayers) {
        return KTX_INVALID_OPERATION;
    }

    if (This->generateMipmaps) {
        uint32_t max_dim;
        VkFormatProperties    formatProperties;
        VkFormatFeatureFlags  formatFeatureFlags;
        VkFormatFeatureFlags  neededFeatures
            = VK_FORMAT_FEATURE_BLIT_DST_BIT | VK_FORMAT_FEATURE_BLIT_SRC_BIT;
        vdi->vkFuncs.vkGetPhysicalDeviceFormatProperties(vdi->physicalDevice,
                                            vkFormat,
                                            &formatProperties);
        assert(vResult == VK_SUCCESS);
        if (tiling == VK_IMAGE_TILING_OPTIMAL)
            formatFeatureFlags = formatProperties.optimalTilingFeatures;
        else
            formatFeatureFlags = formatProperties.linearTilingFeatures;

        if ((formatFeatureFlags & neededFeatures) != neededFeatures)
            return KTX_INVALID_OPERATION;

        if (formatFeatureFlags & VK_FORMAT_FEATURE_SAMPLED_IMAGE_FILTER_LINEAR_BIT)
            blitFilter = VK_FILTER_LINEAR;
        else
            blitFilter = VK_FILTER_NEAREST; // XXX INVALID_OP?

        max_dim = MAX(MAX(This->baseWidth, This->baseHeight), This->baseDepth);
        numImageLevels = (uint32_t)floor(log2(max_dim)) + 1;
    } else {
        numImageLevels = This->numLevels;
    }

    if (numImageLevels > imageFormatProperties.maxMipLevels) {
        return KTX_INVALID_OPERATION;
    }

    if (This->classId == ktxTexture2_c) {
        canUseFasterPath = KTX_TRUE;
    } else {
        ktx_uint32_t actualRowPitch = ktxTexture_GetRowPitch(This, 0);
        ktx_uint32_t tightRowPitch = elementSize * This->baseWidth;
        // If the texture's images do not have any row padding, we can use a
        // faster path. Only uncompressed textures might have padding.
        //
        // The first test in the if will match compressed textures, because
        // they all have a block size that is a multiple of 4, as well as
        // a class of uncompressed textures that will never need padding.
        //
        // The second test matches textures whose level 0 has no padding. Any
        // texture whose block size is not a multiple of 4 will need padding
        // at some miplevel even if level 0 does not. So, if more than 1 level
        // exists, we must use the slower path.
        //
        // Note all elementSizes > 4 Will be a multiple of 4, so only
        // elementSizes of 1, 2 & 3 are a concern here.
        if (elementSize % 4 == 0  /* There'll be no padding at any level. */
               /* There is no padding at level 0 and no other levels. */
            || (This->numLevels == 1 && actualRowPitch == tightRowPitch))
            canUseFasterPath = KTX_TRUE;
        else
            canUseFasterPath = KTX_FALSE;
    }

    vkTexture->width = This->baseWidth;
    vkTexture->height = This->baseHeight;
    vkTexture->depth = This->baseDepth;
    vkTexture->imageLayout = finalLayout;
    vkTexture->imageFormat = vkFormat;
    vkTexture->levelCount = numImageLevels;
    vkTexture->layerCount = numImageLayers;
    vkTexture->viewType = viewType;
    vkTexture->vkDestroyImage = vdi->vkFuncs.vkDestroyImage;
    vkTexture->vkFreeMemory = vdi->vkFuncs.vkFreeMemory;

    VK_CHECK_RESULT(
            vdi->vkFuncs.vkBeginCommandBuffer(vdi->cmdBuffer, &cmdBufBeginInfo)
            );

    if (tiling == VK_IMAGE_TILING_OPTIMAL)
    {
        // Create a host-visible staging buffer that contains the raw image data
        VkBuffer stagingBuffer;
        VkDeviceMemory stagingMemory = VK_NULL_HANDLE;
        VkBufferImageCopy* copyRegions;
        VkDeviceSize textureSize;
        VkBufferCreateInfo bufferCreateInfo = {
          .sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,
          .pNext = NULL
        };
        VkImageSubresourceRange subresourceRange;
        VkFence copyFence;
        VkFenceCreateInfo fenceCreateInfo = {
            .sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO,
            .pNext = NULL,
            .flags = VK_FLAGS_NONE
        };
        VkSubmitInfo submitInfo = {
            .sType = VK_STRUCTURE_TYPE_SUBMIT_INFO,
            .pNext = NULL
        };
        ktx_uint8_t* pMappedStagingBuffer;
        ktx_uint32_t numCopyRegions;
        user_cbdata_optimal cbData;


        textureSize = ktxTexture_GetDataSizeUncompressed(This);
        bufferCreateInfo.size = textureSize;
        if (canUseFasterPath) {
            /*
             * Because all array layers and faces are the same size they can
             * be copied in a single operation so there'll be 1 copy per mip
             * level.
             */
            numCopyRegions = This->numLevels;
        } else {
            /*
             * Have to copy all images individually into the staging
             * buffer so we can place them at correct multiples of
             * elementSize and 4 and also need a copy region per image
             * in case they end up with padding between them.
             */
            numCopyRegions = This->isArray ? This->numLevels
                                  : This->numLevels * This->numFaces;
            /*
             * Add extra space to allow for possible padding described
             * above. A bit ad-hoc but it's only a small amount of
             * memory.
             */
            bufferCreateInfo.size += numCopyRegions * elementSize * 4;
        }
        copyRegions = (VkBufferImageCopy*)malloc(sizeof(VkBufferImageCopy)
                                                   * numCopyRegions);
        if (copyRegions == NULL) {
            return KTX_OUT_OF_MEMORY;
        }

        // This buffer is used as a transfer source for the buffer copy
        bufferCreateInfo.usage = VK_BUFFER_USAGE_TRANSFER_SRC_BIT;
        bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;

        VK_CHECK_RESULT(
                vdi->vkFuncs.vkCreateBuffer(vdi->device, &bufferCreateInfo,
                                       vdi->pAllocator, &stagingBuffer));

        // Get memory requirements for the staging buffer (alignment,
        // memory type bits)
        vdi->vkFuncs.vkGetBufferMemoryRequirements(vdi->device, stagingBuffer, &memReqs);

        memAllocInfo.allocationSize = memReqs.size;
        // Get memory type index for a host visible buffer
        memAllocInfo.memoryTypeIndex = ktxVulkanDeviceInfo_getMemoryType(
                vdi,
                memReqs.memoryTypeBits,
                VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT
              | VK_MEMORY_PROPERTY_HOST_COHERENT_BIT
        );

        uint64_t stagingAllocId = 0ull;
        if (!useSuballocator) {
            vResult = vdi->vkFuncs.vkAllocateMemory(vdi->device, &memAllocInfo,
                vdi->pAllocator, &stagingMemory);
            if (vResult != VK_SUCCESS) {
                free(copyRegions);
                return KTX_OUT_OF_MEMORY;
            }
            VK_CHECK_RESULT(
                    vdi->vkFuncs.vkBindBufferMemory(vdi->device, stagingBuffer,
                        stagingMemory, 0));

            VK_CHECK_RESULT(
                    vdi->vkFuncs.vkMapMemory(vdi->device, stagingMemory, 0,
                        memReqs.size, 0,
                        (void**)&pMappedStagingBuffer));
        }
        else {
            uint64_t numPages = 0ull;
            stagingAllocId = subAllocatorCallbacks->allocMemFuncPtr(&memAllocInfo, &memReqs, &numPages);
            if (stagingAllocId == 0ull) {
                free(copyRegions);
                return KTX_OUT_OF_MEMORY;
            }
            if (numPages > 1ull) { // Sparse binding of KTX textures is unsupported for the moment
                free(copyRegions);
                return KTX_UNSUPPORTED_FEATURE;
            }
            VK_CHECK_RESULT(
                subAllocatorCallbacks->bindBufferFuncPtr(stagingBuffer, stagingAllocId));
            VK_CHECK_RESULT(
                subAllocatorCallbacks->memoryMapFuncPtr(stagingAllocId, 0ull, 
                &memReqs.size,
                (void**)&pMappedStagingBuffer));
        }

        cbData.offset = 0;
        cbData.region = copyRegions;
        cbData.numFaces = This->numFaces;
        cbData.numLayers = This->numLayers;
        cbData.dest = pMappedStagingBuffer;
        cbData.elementSize = elementSize;
        cbData.numDimensions = This->numDimensions;
#if defined(_DEBUG)
        cbData.regionsArrayEnd = copyRegions + numCopyRegions;
#endif
        if (canUseFasterPath) {
            // Bulk load the data to the staging buffer and iterate
            // over levels.

            if (This->pData) {
                // Image data has already been loaded. Copy to staging
                // buffer.
                assert(This->dataSize <= memAllocInfo.allocationSize);
                memcpy(pMappedStagingBuffer, This->pData, This->dataSize);
            } else {
                /* Load the image data directly into the staging buffer. */
                /* The strange cast quiets an Xcode warning when building
                 * for the Generic iOS Device where size_t is 32-bit even
                 * when building for arm64. */
                kResult = ktxTexture_LoadImageData(This,
                                      pMappedStagingBuffer,
                                      (ktx_size_t)memAllocInfo.allocationSize);
                if (kResult != KTX_SUCCESS)
                    return kResult;
            }

            // Iterate over mip levels to set up the copy regions.
            kResult = ktxTexture_IterateLevels(This,
                                               optimalTilingCallback,
                                               &cbData);
            // XXX Check for possible errors.
        } else {
            // Iterate over face-levels with callback that copies the
            // face-levels to Vulkan-valid offsets in the staging buffer while
            // removing padding. Using face-levels minimizes pre-staging-buffer
            // buffering, in the event the data is not already loaded.
            if (This->pData) {
                kResult = ktxTexture_IterateLevelFaces(
                                            This,
                                            optimalTilingPadCallback,
                                            &cbData);
            } else {
                kResult = ktxTexture_IterateLoadLevelFaces(
                                            This,
                                            optimalTilingPadCallback,
                                            &cbData);
                // XXX Check for possible errors.
            }
        }

        if (!useSuballocator)
            vdi->vkFuncs.vkUnmapMemory(vdi->device, stagingMemory);
        else
            subAllocatorCallbacks->memoryUnmapFuncPtr(stagingAllocId, 0ull);

        // Create optimal tiled target image
        imageCreateInfo.imageType = imageType;
        imageCreateInfo.flags = createFlags;
        imageCreateInfo.format = vkFormat;
        // numImageLevels ensures enough levels for generateMipmaps.
        imageCreateInfo.mipLevels = numImageLevels;
        imageCreateInfo.arrayLayers = numImageLayers;
        imageCreateInfo.samples = VK_SAMPLE_COUNT_1_BIT;
        imageCreateInfo.tiling = VK_IMAGE_TILING_OPTIMAL;
        imageCreateInfo.usage = usageFlags;
        imageCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
        imageCreateInfo.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
        imageCreateInfo.extent.width = vkTexture->width;
        imageCreateInfo.extent.height = vkTexture->height;
        imageCreateInfo.extent.depth = vkTexture->depth;

        VK_CHECK_RESULT(
                vdi->vkFuncs.vkCreateImage(vdi->device, &imageCreateInfo,
                                      vdi->pAllocator, &vkTexture->image));

        vdi->vkFuncs.vkGetImageMemoryRequirements(vdi->device, vkTexture->image, &memReqs);

        memAllocInfo.allocationSize = memReqs.size;
        memAllocInfo.memoryTypeIndex = ktxVulkanDeviceInfo_getMemoryType(
            vdi, memReqs.memoryTypeBits,
            VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT);

        if (!useSuballocator) {
            VK_CHECK_RESULT(
                vdi->vkFuncs.vkAllocateMemory(vdi->device, &memAllocInfo,
                    vdi->pAllocator,
                    &vkTexture->deviceMemory));
            VK_CHECK_RESULT(
                vdi->vkFuncs.vkBindImageMemory(vdi->device, vkTexture->image,
                    vkTexture->deviceMemory, 0));
        }
        else {
            uint64_t numPages = 0ull;
            vkTexture->allocationId = subAllocatorCallbacks->allocMemFuncPtr(&memAllocInfo, &memReqs, &numPages);
            if (vkTexture->allocationId == 0ull) {
                return KTX_OUT_OF_MEMORY;
            }
            if(numPages > 1ull) { // Sparse binding of KTX textures is unsupported for the moment
                return KTX_UNSUPPORTED_FEATURE;
            }
            VK_CHECK_RESULT(
                subAllocatorCallbacks->bindImageFuncPtr(vkTexture->image, vkTexture->allocationId));
        }

        subresourceRange.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
        subresourceRange.baseMipLevel = 0;
        subresourceRange.levelCount = This->numLevels;
        subresourceRange.baseArrayLayer = 0;
        subresourceRange.layerCount = numImageLayers;

        // Image barrier to transition, possibly only the base level, image
        // layout to TRANSFER_DST_OPTIMAL so it can be used as the copy
        // destination.
        setImageLayout(
            vdi->vkFuncs,
            vdi->cmdBuffer,
            vkTexture->image,
            VK_IMAGE_LAYOUT_UNDEFINED,
            VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
            subresourceRange);

        // Copy mip levels from staging buffer
        vdi->vkFuncs.vkCmdCopyBufferToImage(
            vdi->cmdBuffer, stagingBuffer,
            vkTexture->image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
            numCopyRegions, copyRegions
            );

        free(copyRegions);

        if (This->generateMipmaps) {
            generateMipmaps(vkTexture, vdi,
                            blitFilter, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL);
        } else {
            // Transition image layout to finalLayout after all mip levels
            // have been copied.
            // In this case numImageLevels == This->numLevels
            //subresourceRange.levelCount = numImageLevels;
            setImageLayout(
                vdi->vkFuncs,
                vdi->cmdBuffer,
                vkTexture->image,
                VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
                finalLayout,
                subresourceRange);
        }

        // Submit command buffer containing copy and image layout commands
        VK_CHECK_RESULT(
                vdi->vkFuncs.vkEndCommandBuffer(vdi->cmdBuffer));

        // Create a fence to make sure that the copies have finished before
        // continuing
        VK_CHECK_RESULT(
                vdi->vkFuncs.vkCreateFence(vdi->device, &fenceCreateInfo,
                                      vdi->pAllocator, &copyFence));

        submitInfo.commandBufferCount = 1;
        submitInfo.pCommandBuffers = &vdi->cmdBuffer;

        VK_CHECK_RESULT(
                vdi->vkFuncs.vkQueueSubmit(vdi->queue, 1, &submitInfo, copyFence));

        VK_CHECK_RESULT(
                vdi->vkFuncs.vkWaitForFences(vdi->device, 1, &copyFence,
                                        VK_TRUE, DEFAULT_FENCE_TIMEOUT));

        vdi->vkFuncs.vkDestroyFence(vdi->device, copyFence, vdi->pAllocator);

        // Clean up staging resources
        if (!useSuballocator)
            vdi->vkFuncs.vkFreeMemory(vdi->device, stagingMemory, vdi->pAllocator);
        else
            subAllocatorCallbacks->freeMemFuncPtr(stagingAllocId);
        vdi->vkFuncs.vkDestroyBuffer(vdi->device, stagingBuffer, vdi->pAllocator);
    }
    else
    {
        VkImage mappableImage;
        VkDeviceMemory mappableMemory = VK_NULL_HANDLE;
        VkFence nullFence = { VK_NULL_HANDLE };
        VkSubmitInfo submitInfo = {
            .sType = VK_STRUCTURE_TYPE_SUBMIT_INFO,
            .pNext = NULL
        };
        user_cbdata_linear cbData;
        PFNKTXITERCB callback;

        imageCreateInfo.imageType = imageType;
        imageCreateInfo.flags = createFlags;
        imageCreateInfo.format = vkFormat;
        imageCreateInfo.extent.width = vkTexture->width;
        imageCreateInfo.extent.height = vkTexture->height;
        imageCreateInfo.extent.depth = vkTexture->depth;
        // numImageLevels ensures enough levels for generateMipmaps.
        imageCreateInfo.mipLevels = numImageLevels;
        imageCreateInfo.arrayLayers = numImageLayers;
        imageCreateInfo.samples = VK_SAMPLE_COUNT_1_BIT;
        imageCreateInfo.tiling = VK_IMAGE_TILING_LINEAR;
        imageCreateInfo.usage = usageFlags;
        imageCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
        imageCreateInfo.initialLayout = VK_IMAGE_LAYOUT_PREINITIALIZED;

        // Load mip map level 0 to linear tiling image
        VK_CHECK_RESULT(
                vdi->vkFuncs.vkCreateImage(vdi->device, &imageCreateInfo,
                                      vdi->pAllocator, &mappableImage));

        // Get memory requirements for this image
        // like size and alignment
        vdi->vkFuncs.vkGetImageMemoryRequirements(vdi->device, mappableImage, &memReqs);
        // Set memory allocation size to required memory size
        memAllocInfo.allocationSize = memReqs.size;

        // Get memory type that can be mapped to host memory
        memAllocInfo.memoryTypeIndex = ktxVulkanDeviceInfo_getMemoryType(
                vdi,
                memReqs.memoryTypeBits,
                VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT | VK_MEMORY_PROPERTY_HOST_COHERENT_BIT);

        // Allocate host memory
        if (!useSuballocator) {
            vResult = vdi->vkFuncs.vkAllocateMemory(vdi->device, &memAllocInfo, vdi->pAllocator,
                &mappableMemory);
            if (vResult != VK_SUCCESS) {
                return KTX_OUT_OF_MEMORY;
            }
            VK_CHECK_RESULT(
                vdi->vkFuncs.vkBindImageMemory(vdi->device, mappableImage,
                    mappableMemory, 0));
        }
        else {
            uint64_t numPages = 0ull;
            vkTexture->allocationId = subAllocatorCallbacks->allocMemFuncPtr(&memAllocInfo, &memReqs, &numPages);
            if (vkTexture->allocationId == 0ull) {
                return KTX_OUT_OF_MEMORY;
            }
            if (numPages > 1ull) { // Sparse binding of KTX textures is unsupported for the moment
                return KTX_UNSUPPORTED_FEATURE;
            }
            VK_CHECK_RESULT(
                subAllocatorCallbacks->bindImageFuncPtr(mappableImage, vkTexture->allocationId));
        }

        cbData.vkFuncs = vdi->vkFuncs;
        cbData.destImage = mappableImage;
        cbData.device = vdi->device;
        cbData.texture = This;
        callback = canUseFasterPath ?
                         linearTilingCallback : linearTilingPadCallback;

        // Map image memory
        if (!useSuballocator) {
            VK_CHECK_RESULT(
                vdi->vkFuncs.vkMapMemory(vdi->device, mappableMemory, 0,
                    memReqs.size, 0, (void**)&cbData.dest));
        }
        else {
            VK_CHECK_RESULT(
                subAllocatorCallbacks->memoryMapFuncPtr(vkTexture->allocationId, 0ull,
                    &memReqs.size, (void**)&cbData.dest));
        }

        // Iterate over images to copy texture data into mapped image memory.
        if (ktxTexture_isActiveStream(This)) {
            kResult = ktxTexture_IterateLoadLevelFaces(This,
                                                       callback,
                                                       &cbData);
        } else {
            kResult = ktxTexture_IterateLevelFaces(This,
                                                   callback,
                                                   &cbData);
        }
        // XXX Check for possible errors
        if (!useSuballocator)
            vdi->vkFuncs.vkUnmapMemory(vdi->device, mappableMemory);
        else
            subAllocatorCallbacks->memoryUnmapFuncPtr(vkTexture->allocationId, 0ull);

        // Linear tiled images can be directly used as textures.
        vkTexture->image = mappableImage;
        if (!useSuballocator) vkTexture->deviceMemory = mappableMemory;

        if (This->generateMipmaps) {
            generateMipmaps(vkTexture, vdi,
                            blitFilter,
                            VK_IMAGE_LAYOUT_PREINITIALIZED);
        } else {
            VkImageSubresourceRange subresourceRange;
            subresourceRange.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
            subresourceRange.baseMipLevel = 0;
            subresourceRange.levelCount = numImageLevels;
            subresourceRange.baseArrayLayer = 0;
            subresourceRange.layerCount = numImageLayers;

           // Transition image layout to finalLayout.
            setImageLayout(
                vdi->vkFuncs,
                vdi->cmdBuffer,
                vkTexture->image,
                VK_IMAGE_LAYOUT_PREINITIALIZED,
                finalLayout,
                subresourceRange);
        }

        // Submit command buffer containing image layout commands
        VK_CHECK_RESULT(vdi->vkFuncs.vkEndCommandBuffer(vdi->cmdBuffer));

        submitInfo.waitSemaphoreCount = 0;
        submitInfo.commandBufferCount = 1;
        submitInfo.pCommandBuffers = &vdi->cmdBuffer;

        VK_CHECK_RESULT(vdi->vkFuncs.vkQueueSubmit(vdi->queue, 1, &submitInfo, nullFence));
        VK_CHECK_RESULT(vdi->vkFuncs.vkQueueWaitIdle(vdi->queue));
    }
    return KTX_SUCCESS;
}